

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Abc_ResubComputeFunction
              (void **ppDivs,int nDivs,int nWords,int nLimit,int nDivsMax,int iChoice,int fUseXor,
              int fDebug,int fVerbose,int **ppArray)

{
  Gia_ResbMan_t *pGVar1;
  int iVar2;
  Vec_Ptr_t Divs;
  
  Divs.nCap = nDivs;
  Divs.nSize = nDivs;
  Divs.pArray = ppDivs;
  if (s_pResbMan == (Gia_ResbMan_t *)0x0) {
    __assert_fail("s_pResbMan != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x5a6,
                  "int Abc_ResubComputeFunction(void **, int, int, int, int, int, int, int, int, int **)"
                 );
  }
  Gia_ManResubPerform(s_pResbMan,&Divs,nWords,nLimit,nDivsMax,iChoice,fUseXor,fDebug,
                      (uint)(fVerbose == 2));
  if (fVerbose != 0) {
    iVar2 = s_pResbMan->vGates->nSize;
    if (2 < iVar2 + 1U) {
      printf("      Gain = %2d  Gates = %2d  __________  F = ",(ulong)((nLimit - iVar2 / 2) + 1));
      Gia_ManResubPrint(s_pResbMan->vGates,nDivs);
      putchar(10);
    }
  }
  if (fDebug != 0) {
    iVar2 = Gia_ManResubVerify(s_pResbMan,(word *)0x0);
    if (iVar2 == 0) {
      Gia_ManResubPrint(s_pResbMan->vGates,nDivs);
      puts("Verification FAILED.");
    }
  }
  pGVar1 = s_pResbMan;
  *ppArray = s_pResbMan->vGates->pArray;
  iVar2 = pGVar1->vGates->nSize;
  if (iVar2 / 2 <= nLimit) {
    return iVar2;
  }
  __assert_fail("Vec_IntSize(s_pResbMan->vGates)/2 <= nLimit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                ,0x5bd,
                "int Abc_ResubComputeFunction(void **, int, int, int, int, int, int, int, int, int **)"
               );
}

Assistant:

int Abc_ResubComputeFunction( void ** ppDivs, int nDivs, int nWords, int nLimit, int nDivsMax, int iChoice, int fUseXor, int fDebug, int fVerbose, int ** ppArray )
{
    Vec_Ptr_t Divs = { nDivs, nDivs, ppDivs };
    assert( s_pResbMan != NULL ); // first call Abc_ResubPrepareManager()
    Gia_ManResubPerform( s_pResbMan, &Divs, nWords, nLimit, nDivsMax, iChoice, fUseXor, fDebug, fVerbose==2 );
    if ( fVerbose )
    {
        int nGates = Vec_IntSize(s_pResbMan->vGates)/2;
        if ( nGates )
        {
            printf( "      Gain = %2d  Gates = %2d  __________  F = ", nLimit+1-nGates, nGates );
            Gia_ManResubPrint( s_pResbMan->vGates, nDivs );
            printf( "\n" );
        }
    }
    if ( fDebug )
    {
        if ( !Gia_ManResubVerify(s_pResbMan, NULL) )
        {
            Gia_ManResubPrint( s_pResbMan->vGates, nDivs );
            printf( "Verification FAILED.\n" );
        }
        //else
        //    printf( "Verification succeeded.\n" );
    }
    *ppArray = Vec_IntArray(s_pResbMan->vGates);
    assert( Vec_IntSize(s_pResbMan->vGates)/2 <= nLimit );
    return Vec_IntSize(s_pResbMan->vGates);
}